

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_8x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte in_CL;
  long in_RSI;
  int i;
  int lr_flip;
  int ud_flip;
  int bit;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i out [32];
  __m128i in [32];
  int local_458;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  fwd_transform_1d_sse4_1 p_Var4;
  fwd_transform_1d_sse4_1 p_Var5;
  int16_t *input_00;
  longlong local_428 [8];
  int in_stack_fffffffffffffc1c;
  int in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  __m128i *in_stack_fffffffffffffc28;
  __m128i *in_stack_fffffffffffffc30;
  longlong local_228 [66];
  byte local_15;
  long local_10;
  
  input_00 = (int16_t *)av1_fwd_txfm_shift_ls[7];
  local_15 = in_CL;
  local_10 = in_RSI;
  iVar1 = get_txw_idx('\a');
  iVar2 = get_txh_idx('\a');
  p_Var5 = col_highbd_txfm8x16_arr[local_15];
  p_Var4 = row_highbd_txfm8x8_arr[local_15];
  iVar3 = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  get_flip_cfg(local_15,(int *)&stack0xfffffffffffffbb0,(int *)&stack0xfffffffffffffbac);
  load_buffer_8x16(input_00,(__m128i *)CONCAT44(iVar1,iVar2),(int)((ulong)p_Var5 >> 0x20),
                   (int)p_Var5,(int)((ulong)p_Var4 >> 0x20),(int)p_Var4);
  (*p_Var5)((__m128i *)local_228,(__m128i *)local_228,iVar3,2);
  col_txfm_8x16_rounding
            ((__m128i *)CONCAT44(iVar3,in_stack_fffffffffffffbb0),in_stack_fffffffffffffbac);
  transpose_8x8(in_stack_fffffffffffffc28,
                (__m128i *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  transpose_8x8(in_stack_fffffffffffffc28,
                (__m128i *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  for (local_458 = 0; local_458 < 2; local_458 = local_458 + 1) {
    (*p_Var4)((__m128i *)(local_428 + (long)(local_458 << 4) * 2),(__m128i *)local_428,iVar3,2);
    av1_round_shift_rect_array_32_sse4_1
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
               in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    write_buffer_16x8((__m128i *)local_428,(int32_t *)(local_10 + (long)(local_458 << 3) * 4),0x10);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bit, 2);
  col_txfm_8x16_rounding(in, -shift[1]);
  transpose_8x8(in, out);
  transpose_8x8(in + 16, out + 16);

  for (int i = 0; i < 2; i++) {
    row_txfm(out + i * 16, out, bit, 2);
    av1_round_shift_rect_array_32_sse4_1(out, out, 16, -shift[2], NewSqrt2);
    write_buffer_16x8(out, coeff + i * 8, 16);
  }
  (void)bd;
}